

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::TSPI_PDU::SetEntityLinearOrientation(TSPI_PDU *this,LE_EulerAngles *O)

{
  KUINT16 *pKVar1;
  
  if (((this->m_TSPIFlagUnion).m_ui8Flag & 2) == 0) {
    (this->m_TSPIFlagUnion).m_ui8Flag = (this->m_TSPIFlagUnion).m_ui8Flag | 2;
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + 3;
  }
  DATA_TYPE::LE_EulerAngles::operator=(&this->m_Ori,O);
  return;
}

Assistant:

void TSPI_PDU::SetEntityOrientationFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_TSPIFlagUnion.m_ui8Ori )return;

    m_TSPIFlagUnion.m_ui8Ori = F;

    if( F )
    {
        m_ui16PDULength += LE_EulerAngles::LE_EULER_ANGLES_SIZE;
    }
    else
    {
        m_ui16PDULength -= LE_EulerAngles::LE_EULER_ANGLES_SIZE;
    }
}